

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CETime.cpp
# Opt level: O1

double CETime::CurrentUTC(void)

{
  rep rVar1;
  rep rVar2;
  undefined1 auVar3 [16];
  time_point millisec_start;
  time_t now_t;
  time_point now;
  tm midnight;
  duration<long,_std::ratio<1L,_1000000000L>_> local_88;
  duration<long,_std::ratio<1L,_1000000L>_> in_stack_ffffffffffffff80;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_78;
  time_t local_70;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_68;
  tm local_60;
  
  local_68.__d.__r = (duration)std::chrono::_V2::system_clock::now();
  local_60._0_8_ = local_68.__d.__r;
  local_70 = std::chrono::_V2::system_clock::to_time_t((time_point *)&local_60);
  gmtime_r(&local_70,&local_60);
  local_60.tm_hour = 0;
  local_60.tm_sec = 0;
  local_60.tm_min = 0;
  mktime(&local_60);
  local_78.__d.__r =
       (duration)std::chrono::_V2::system_clock::from_time_t(in_stack_ffffffffffffff80.__r);
  local_88.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_78);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
            (&local_88);
  rVar1 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffff80);
  local_88.__r = (rep)std::chrono::
                      time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
                      ::time_since_epoch(&local_68);
  std::chrono::
  duration_cast<std::chrono::duration<long,std::ratio<1l,1000000l>>,long,std::ratio<1l,1000000000l>>
            (&local_88);
  rVar2 = std::chrono::duration<long,_std::ratio<1L,_1000000L>_>::count
                    ((duration<long,_std::ratio<1L,_1000000L>_> *)&stack0xffffffffffffff80);
  auVar3._0_8_ = (double)rVar2;
  auVar3._8_8_ = (double)rVar1;
  auVar3 = divpd(auVar3,_DAT_001518a0);
  return (auVar3._0_8_ - auVar3._8_8_) - (double)local_60.tm_gmtoff;
}

Assistant:

double CETime::CurrentUTC()
{
    // Construct time_t of this moment
    std::chrono::system_clock::time_point now(std::chrono::system_clock::now());
    std::time_t now_t(std::chrono::system_clock::to_time_t(
                        std::chrono::system_clock::time_point(now)));
    
    // Get the time at midnight
    struct tm midnight;
    gmtime_r(&now_t, &midnight) ;
    midnight.tm_hour = 0 ;
    midnight.tm_min = 0 ;
    midnight.tm_sec = 0 ;

    // Midnight object
    auto millisec_start(std::chrono::system_clock::from_time_t(mktime(&midnight)));

    double start = std::chrono::duration_cast<std::chrono::microseconds>(millisec_start.time_since_epoch()).count()/1000000.0 ;
    double stop  = std::chrono::duration_cast<std::chrono::microseconds>(now.time_since_epoch()).count()/1000000.0 ;
    
    // Return seconds and fractions of a second since midnight
    return stop-start-midnight.tm_gmtoff ;
}